

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void kf_bfly2(kiss_fft_cpx *Fout,size_t fstride,kiss_fft_cfg st,int m)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  kiss_fft_cpx t;
  kiss_fft_cpx *tw1;
  kiss_fft_cpx *Fout2;
  int m_local;
  kiss_fft_cfg st_local;
  size_t fstride_local;
  kiss_fft_cpx *Fout_local;
  
  tw1 = st->twiddles;
  Fout2 = Fout + m;
  m_local = m;
  Fout_local = Fout;
  do {
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)tw1->r),ZEXT416((uint)Fout2->r),
                             ZEXT416((uint)-(Fout2->i * tw1->i)));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)tw1->i),ZEXT416((uint)Fout2->r),
                             ZEXT416((uint)(Fout2->i * tw1->r)));
    tw1 = tw1 + fstride;
    Fout2->r = Fout_local->r - auVar1._0_4_;
    Fout2->i = Fout_local->i - auVar2._0_4_;
    Fout_local->r = auVar1._0_4_ + Fout_local->r;
    Fout_local->i = auVar2._0_4_ + Fout_local->i;
    Fout2 = Fout2 + 1;
    Fout_local = Fout_local + 1;
    m_local = m_local + -1;
  } while (m_local != 0);
  return;
}

Assistant:

static void kf_bfly2(
        kiss_fft_cpx * Fout,
        const size_t fstride,
        const kiss_fft_cfg st,
        int m
        )
{
    kiss_fft_cpx * Fout2;
    kiss_fft_cpx * tw1 = st->twiddles;
    kiss_fft_cpx t;
    Fout2 = Fout + m;
    do{
        C_FIXDIV(*Fout,2); C_FIXDIV(*Fout2,2);

        C_MUL (t,  *Fout2 , *tw1);
        tw1 += fstride;
        C_SUB( *Fout2 ,  *Fout , t );
        C_ADDTO( *Fout ,  t );
        ++Fout2;
        ++Fout;
    }while (--m);
}